

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool-inl.h
# Opt level: O0

void __thiscall
spdlog::details::thread_pool::thread_pool
          (thread_pool *this,size_t q_max_items,size_t threads_n,function<void_()> *on_thread_start)

{
  function<void_()> *in_RCX;
  ulong in_RDX;
  size_t in_RDI;
  size_t i;
  type *in_stack_ffffffffffffff58;
  mpmc_blocking_queue<spdlog::details::async_msg> *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff90;
  ulong local_60;
  undefined1 local_41 [41];
  ulong local_18;
  
  local_18 = in_RDX;
  mpmc_blocking_queue<spdlog::details::async_msg>::mpmc_blocking_queue
            (in_stack_ffffffffffffff70,in_RDI);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1e77dc);
  if ((local_18 == 0) || (1000 < local_18)) {
    in_stack_ffffffffffffff58 = (type *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_41 + 1),
               "spdlog::thread_pool(): invalid threads_n param (valid range is 1-1000)",
               (allocator *)in_stack_ffffffffffffff58);
    throw_spdlog_ex(in_stack_ffffffffffffff90);
    std::__cxx11::string::~string((string *)(local_41 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_41);
  }
  for (local_60 = 0; local_60 < local_18; local_60 = local_60 + 1) {
    std::function<void_()>::function(in_RCX,(function<void_()> *)in_stack_ffffffffffffff58);
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<spdlog::details::thread_pool::thread_pool(unsigned_long,unsigned_long,std::function<void()>)::__0>
              ((vector<std::thread,_std::allocator<std::thread>_> *)in_RCX,in_stack_ffffffffffffff58
              );
    thread_pool(unsigned_long,unsigned_long,std::function<void()>)::$_0::~__0((type *)0x1e78d6);
  }
  return;
}

Assistant:

SPDLOG_INLINE thread_pool::thread_pool(size_t q_max_items, size_t threads_n, std::function<void()> on_thread_start)
    : q_(q_max_items)
{
    if (threads_n == 0 || threads_n > 1000)
    {
        throw_spdlog_ex("spdlog::thread_pool(): invalid threads_n param (valid "
                        "range is 1-1000)");
    }
    for (size_t i = 0; i < threads_n; i++)
    {
        threads_.emplace_back([this, on_thread_start] {
            on_thread_start();
            this->thread_pool::worker_loop_();
        });
    }
}